

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O3

int ge25519_unpack_negative_vartime(ge25519 *r,uchar *p)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [13];
  undefined1 auVar526 [13];
  undefined1 auVar527 [13];
  undefined1 auVar528 [13];
  undefined1 auVar529 [13];
  undefined1 auVar530 [13];
  undefined1 auVar531 [13];
  undefined1 auVar532 [13];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  long lVar582;
  uint64_t uVar583;
  ulong uVar584;
  ulong uVar585;
  ulong uVar586;
  ulong uVar587;
  ulong uVar588;
  ulong uVar589;
  ulong uVar590;
  ulong uVar591;
  ulong uVar592;
  ulong uVar593;
  ulong uVar594;
  ulong uVar595;
  long lVar596;
  undefined1 *puVar597;
  ulong uVar598;
  uint64_t uVar599;
  ulong uVar600;
  uint64_t uVar601;
  ulong uVar602;
  ulong uVar603;
  ulong uVar604;
  ulong uVar605;
  ulong uVar606;
  ulong uVar607;
  ulong uVar608;
  uint64_t uVar609;
  ulong uVar610;
  ulong uVar611;
  ulong uVar612;
  ulong uVar613;
  ulong uVar614;
  ulong uVar615;
  ulong uVar616;
  ulong uVar617;
  ulong uVar618;
  ulong uVar619;
  ulong uVar620;
  ulong uVar621;
  ulong uVar622;
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  uchar check [32];
  bignum25519 t0;
  bignum25519 c;
  ulong local_208;
  uint64_t local_b8;
  undefined1 auStack_b0 [40];
  uint64_t local_88 [6];
  uint64_t local_58 [5];
  
  uVar589 = *(ulong *)p & 0x7ffffffffffff;
  uVar607 = *(ulong *)p >> 0x33 | (*(ulong *)(p + 8) & 0x3fffffffff) << 0xd;
  uVar595 = *(ulong *)(p + 8) >> 0x26 | (*(ulong *)(p + 0x10) & 0x1ffffff) << 0x1a;
  uVar617 = *(ulong *)(p + 0x10) >> 0x19 | (*(ulong *)(p + 0x18) & 0xfff) << 0x27;
  uVar613 = *(ulong *)(p + 0x18) >> 0xc & 0x7ffffffffffff;
  uVar602 = uVar589 * 2;
  uVar604 = uVar613 * 0x26;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar589;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar589;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar607;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar604;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar595 * 0x26;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar617;
  auVar625 = auVar3 * auVar288 + auVar625 * auVar287 + auVar4 * auVar289;
  uVar584 = auVar625._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar602;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar607;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar595;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar604;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar617 * 0x13;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar617;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar602;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar595;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar607;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar607;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar604;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar617;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar602;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar617;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar607 * 2;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar595;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar613 * 0x13;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar613;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar602;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar613;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar607 * 2;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar617;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar595;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar595;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = auVar625._8_8_ << 0xd | uVar584 >> 0x33;
  auVar533 = auVar7 * auVar292 + auVar6 * auVar291 + auVar5 * auVar290 + auVar533;
  uVar604 = auVar533._0_8_;
  uVar602 = auVar533._8_8_;
  auVar534._8_8_ = uVar602 >> 0x33;
  auVar534._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar534 = auVar8 * auVar293 + auVar9 * auVar294 + auVar10 * auVar295 + auVar534;
  uVar598 = auVar534._0_8_;
  uVar602 = auVar534._8_8_;
  auVar535._8_8_ = uVar602 >> 0x33;
  auVar535._0_8_ = uVar602 * 0x2000 | uVar598 >> 0x33;
  auVar535 = auVar12 * auVar297 + auVar11 * auVar296 + auVar13 * auVar298 + auVar535;
  uVar602 = auVar535._0_8_;
  uVar614 = auVar535._8_8_;
  auVar522._8_8_ = uVar614 >> 0x33;
  auVar522._0_8_ = uVar614 * 0x2000 | uVar602 >> 0x33;
  auVar522 = auVar15 * auVar300 + auVar16 * auVar301 + auVar14 * auVar299 + auVar522;
  uVar614 = auVar522._0_8_;
  uVar584 = (auVar522._8_8_ << 0xd | uVar614 >> 0x33) * 0x13 + (uVar584 & 0x7ffffffffffff);
  uVar610 = uVar584 & 0x7ffffffffffff;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar610;
  uVar618 = (uVar584 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar618;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar610;
  uVar598 = uVar598 & 0x7ffffffffffff;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar598;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar610;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar618;
  uVar602 = uVar602 & 0x7ffffffffffff;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar602;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar610;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar598;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar618;
  uVar614 = uVar614 & 0x7ffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar614;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar610;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar618;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar602;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar598;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar618;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar614;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar602;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar598;
  auVar625 = auVar33 * ZEXT816(0x1f7afc62973807) +
             auVar35 * ZEXT816(0x8949b964e481e1) + auVar34 * ZEXT816(0x70310d2021430b) +
             auVar17 * ZEXT816(0x34dca135978a3) + auVar32 * ZEXT816(0x6164115ad394ed);
  uVar604 = auVar625._0_8_;
  uVar584 = auVar625._8_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar598;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar614;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar602;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar602;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar614;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar614;
  auVar536._8_8_ = uVar584 >> 0x33;
  auVar536._0_8_ = uVar584 * 0x2000 | uVar604 >> 0x33;
  auVar536 = auVar19 * ZEXT816(0x1a8283b156ebd) +
             auVar38 * ZEXT816(0x8949b964e481e1) + auVar36 * ZEXT816(0x6164115ad394ed) +
             auVar37 * ZEXT816(0x70310d2021430b) + auVar18 * ZEXT816(0x34dca135978a3) + auVar536;
  uVar619 = auVar536._0_8_;
  uVar584 = auVar536._8_8_;
  auVar537._8_8_ = uVar584 >> 0x33;
  auVar537._0_8_ = uVar584 * 0x2000 | uVar619 >> 0x33;
  auVar537 = auVar22 * ZEXT816(0x1a8283b156ebd) +
             auVar21 * ZEXT816(0x5e7a26001c029) +
             auVar40 * ZEXT816(0x8949b964e481e1) +
             auVar20 * ZEXT816(0x34dca135978a3) + auVar39 * ZEXT816(0x6164115ad394ed) + auVar537;
  uVar585 = auVar537._0_8_;
  uVar584 = auVar537._8_8_;
  auVar538._8_8_ = uVar584 >> 0x33;
  auVar538._0_8_ = uVar584 * 0x2000 | uVar585 >> 0x33;
  auVar538 = auVar41 * ZEXT816(0x6164115ad394ed) +
             auVar23 * ZEXT816(0x34dca135978a3) + auVar25 * ZEXT816(0x1a8283b156ebd) +
             auVar24 * ZEXT816(0x739c663a03cbb) + auVar26 * ZEXT816(0x5e7a26001c029) + auVar538;
  uVar603 = auVar538._0_8_;
  uVar584 = auVar538._8_8_;
  auVar576._8_8_ = uVar584 >> 0x33;
  auVar576._0_8_ = uVar584 * 0x2000 | uVar603 >> 0x33;
  auVar576 = auVar29 * ZEXT816(0x739c663a03cbb) +
             auVar28 * ZEXT816(0x52036cee2b6ff) +
             auVar27 * ZEXT816(0x34dca135978a3) +
             auVar30 * ZEXT816(0x1a8283b156ebd) + auVar31 * ZEXT816(0x5e7a26001c029) + auVar576;
  uVar586 = auVar576._0_8_;
  uVar600 = (auVar576._8_8_ * 0x2000 | uVar586 >> 0x33) * 0x13 + (uVar604 & 0x7ffffffffffff);
  uVar608 = (uVar600 >> 0x33) + (uVar619 & 0x7ffffffffffff);
  uVar590 = uVar618 + 0x1ffffffffffffc + (uVar610 + 0x1fffffffffffb3 >> 0x33);
  uVar591 = uVar598 + 0x1ffffffffffffc + (uVar590 >> 0x33);
  uVar594 = uVar602 + 0x1ffffffffffffc + (uVar591 >> 0x33);
  uVar592 = uVar614 + 0x1ffffffffffffc + (uVar594 >> 0x33);
  uVar593 = (uVar592 >> 0x33) * 0x13 + (uVar610 + 0x1fffffffffffb3 & 0x7ffffffffffff);
  uVar600 = uVar600 & 0x7ffffffffffff;
  uVar590 = uVar590 & 0x7ffffffffffff;
  uVar591 = uVar591 & 0x7ffffffffffff;
  uVar594 = uVar594 & 0x7ffffffffffff;
  uVar592 = uVar592 & 0x7ffffffffffff;
  uVar602 = uVar600 * 2 + 2;
  uVar600 = uVar600 + 1;
  uVar585 = uVar585 & 0x7ffffffffffff;
  uVar586 = uVar586 & 0x7ffffffffffff;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar600;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar600;
  uVar604 = uVar586 * 0x26;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar608;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar604;
  uVar603 = uVar603 & 0x7ffffffffffff;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar603;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar585 * 0x26;
  auVar625 = auVar42 * auVar302 + auVar44 * auVar304 + auVar43 * auVar303;
  uVar584 = auVar625._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar602;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar608;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar585;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar604;
  uVar619 = uVar603 * 0x13;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar603;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar619;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar585;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar602;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar608;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar608;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar603;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar604;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar603;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar602;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar585;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar608 * 2;
  uVar606 = uVar586 * 0x13;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar586;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar606;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar586;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar602;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar603;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar608 * 2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar585;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar585;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = auVar625._8_8_ << 0xd | uVar584 >> 0x33;
  auVar539 = auVar45 * auVar305 + auVar47 * auVar307 + auVar46 * auVar306 + auVar539;
  uVar604 = auVar539._0_8_;
  uVar602 = auVar539._8_8_;
  auVar540._8_8_ = uVar602 >> 0x33;
  auVar540._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar540 = auVar50 * auVar310 + auVar49 * auVar309 + auVar48 * auVar308 + auVar540;
  uVar610 = auVar540._0_8_;
  uVar602 = auVar540._8_8_;
  auVar541._8_8_ = uVar602 >> 0x33;
  auVar541._0_8_ = uVar602 * 0x2000 | uVar610 >> 0x33;
  auVar541 = auVar51 * auVar311 + auVar52 * auVar312 + auVar53 * auVar313 + auVar541;
  uVar618 = auVar541._0_8_;
  uVar602 = auVar541._8_8_;
  auVar542._8_8_ = uVar602 >> 0x33;
  auVar542._0_8_ = uVar602 * 0x2000 | uVar618 >> 0x33;
  auVar542 = auVar54 * auVar314 + auVar55 * auVar315 + auVar56 * auVar316 + auVar542;
  uVar615 = auVar542._0_8_;
  uVar602 = (auVar542._8_8_ * 0x2000 | uVar615 >> 0x33) * 0x13 + (uVar584 & 0x7ffffffffffff);
  uVar584 = (uVar602 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar602 = uVar602 & 0x7ffffffffffff;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar602;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar600;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar584;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar600;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar602;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar608;
  uVar610 = uVar610 & 0x7ffffffffffff;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar610;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar600;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar585;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar602;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar584;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar608;
  uVar618 = uVar618 & 0x7ffffffffffff;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar618;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar600;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar603;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar602;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar610;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar608;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar585;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar584;
  uVar615 = uVar615 & 0x7ffffffffffff;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar615;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar600;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar586;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar602;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar603;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar584;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar618;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar608;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar610;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar585;
  uVar598 = uVar608 * 0x13;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar584;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar606;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar615;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar598;
  uVar614 = uVar585 * 0x13;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar618;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar614;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar610;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar619;
  auVar625 = auVar75 * auVar335 + auVar74 * auVar334 + auVar73 * auVar333 + auVar57 * auVar317 +
             auVar72 * auVar332;
  uVar604 = auVar625._0_8_;
  uVar602 = auVar625._8_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar610;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar606;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar615;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar614;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar618;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar619;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar618;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar606;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar615;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar619;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar615;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar606;
  auVar543._8_8_ = uVar602 >> 0x33;
  auVar543._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar543 = auVar58 * auVar318 +
             auVar59 * auVar319 + auVar77 * auVar337 + auVar78 * auVar338 + auVar76 * auVar336 +
             auVar543;
  uVar584 = auVar543._0_8_;
  uVar602 = auVar543._8_8_;
  auVar544._8_8_ = uVar602 >> 0x33;
  auVar544._0_8_ = uVar602 * 0x2000 | uVar584 >> 0x33;
  auVar544 = auVar80 * auVar340 + auVar60 * auVar320 + auVar79 * auVar339 + auVar61 * auVar321 +
             auVar62 * auVar322 + auVar544;
  uVar605 = auVar544._0_8_;
  uVar602 = auVar544._8_8_;
  auVar545._8_8_ = uVar602 >> 0x33;
  auVar545._0_8_ = uVar602 * 0x2000 | uVar605 >> 0x33;
  auVar545 = auVar81 * auVar341 + auVar63 * auVar323 + auVar65 * auVar325 + auVar64 * auVar324 +
             auVar66 * auVar326 + auVar545;
  uVar616 = auVar545._0_8_;
  uVar602 = auVar545._8_8_;
  auVar546._8_8_ = uVar602 >> 0x33;
  auVar546._0_8_ = uVar602 * 0x2000 | uVar616 >> 0x33;
  auVar546 = auVar68 * auVar328 + auVar67 * auVar327 + auVar70 * auVar330 + auVar71 * auVar331 +
             auVar69 * auVar329 + auVar546;
  uVar587 = auVar546._0_8_;
  uVar588 = (auVar546._8_8_ * 0x2000 | uVar587 >> 0x33) * 0x13 + (uVar604 & 0x7ffffffffffff);
  uVar620 = (uVar588 >> 0x33) + (uVar584 & 0x7ffffffffffff);
  uVar588 = uVar588 & 0x7ffffffffffff;
  uVar605 = uVar605 & 0x7ffffffffffff;
  uVar587 = uVar587 & 0x7ffffffffffff;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar588;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar588;
  uVar604 = uVar587 * 0x26;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar620;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar604;
  uVar616 = uVar616 & 0x7ffffffffffff;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar616;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar605 * 0x26;
  auVar625 = auVar83 * auVar343 + auVar84 * auVar344 + auVar82 * auVar342;
  uVar584 = auVar625._0_8_;
  uVar602 = uVar588 * 2;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar602;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar620;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar605;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar604;
  uVar615 = uVar616 * 0x13;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar616;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar615;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar605;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar602;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar620;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar620;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar616;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar604;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar616;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar602;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar605;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar620 * 2;
  uVar612 = uVar587 * 0x13;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar587;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar612;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar587;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar602;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar616;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar620 * 2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar605;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar605;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = auVar625._8_8_ << 0xd | uVar584 >> 0x33;
  auVar547 = auVar85 * auVar345 + auVar86 * auVar346 + auVar87 * auVar347 + auVar547;
  uVar602 = auVar547._0_8_;
  uVar604 = auVar547._8_8_;
  auVar548._8_8_ = uVar604 >> 0x33;
  auVar548._0_8_ = uVar604 * 0x2000 | uVar602 >> 0x33;
  auVar548 = auVar90 * auVar350 + auVar89 * auVar349 + auVar88 * auVar348 + auVar548;
  uVar610 = auVar548._0_8_;
  uVar604 = auVar548._8_8_;
  auVar549._8_8_ = uVar604 >> 0x33;
  auVar549._0_8_ = uVar604 * 0x2000 | uVar610 >> 0x33;
  auVar549 = auVar91 * auVar351 + auVar93 * auVar353 + auVar92 * auVar352 + auVar549;
  uVar618 = auVar549._0_8_;
  uVar604 = auVar549._8_8_;
  auVar523._8_8_ = uVar604 >> 0x33;
  auVar523._0_8_ = uVar604 * 0x2000 | uVar618 >> 0x33;
  auVar523 = auVar95 * auVar355 + auVar96 * auVar356 + auVar94 * auVar354 + auVar523;
  uVar604 = auVar523._0_8_;
  uVar584 = (auVar523._8_8_ << 0xd | uVar604 >> 0x33) * 0x13 + (uVar584 & 0x7ffffffffffff);
  uVar602 = (uVar584 >> 0x33) + (uVar602 & 0x7ffffffffffff);
  uVar584 = uVar584 & 0x7ffffffffffff;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar584;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar600;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar602;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar600;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar584;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar608;
  uVar610 = uVar610 & 0x7ffffffffffff;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar610;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar600;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar585;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar584;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar602;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar608;
  uVar618 = uVar618 & 0x7ffffffffffff;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar618;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar600;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar603;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar584;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar610;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar608;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar585;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar602;
  uVar604 = uVar604 & 0x7ffffffffffff;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar604;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar600;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar586;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar584;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar603;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = uVar602;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar618;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar608;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar610;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = uVar585;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar602;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uVar606;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar604;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar598;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar618;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uVar614;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar610;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = uVar619;
  auVar625 = auVar113 * auVar373 + auVar115 * auVar375 + auVar114 * auVar374 + auVar97 * auVar357 +
             auVar112 * auVar372;
  uVar621 = auVar625._0_8_;
  uVar602 = auVar625._8_8_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar610;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar606;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar604;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar614;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar618;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar619;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar618;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar606;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar604;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar619;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar604;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar606;
  auVar550._8_8_ = uVar602 >> 0x33;
  auVar550._0_8_ = uVar602 * 0x2000 | uVar621 >> 0x33;
  auVar550 = auVar118 * auVar378 + auVar116 * auVar376 + auVar117 * auVar377 + auVar99 * auVar359 +
             auVar98 * auVar358 + auVar550;
  uVar610 = auVar550._0_8_;
  uVar602 = auVar550._8_8_;
  auVar551._8_8_ = uVar602 >> 0x33;
  auVar551._0_8_ = uVar602 * 0x2000 | uVar610 >> 0x33;
  auVar551 = auVar119 * auVar379 + auVar100 * auVar360 + auVar120 * auVar380 + auVar101 * auVar361 +
             auVar102 * auVar362 + auVar551;
  uVar611 = auVar551._0_8_;
  uVar602 = auVar551._8_8_;
  auVar552._8_8_ = uVar602 >> 0x33;
  auVar552._0_8_ = uVar602 * 0x2000 | uVar611 >> 0x33;
  auVar552 = auVar106 * auVar366 +
             auVar121 * auVar381 + auVar103 * auVar363 + auVar105 * auVar365 + auVar104 * auVar364 +
             auVar552;
  uVar604 = auVar552._0_8_;
  uVar602 = auVar552._8_8_;
  auVar553._8_8_ = uVar602 >> 0x33;
  auVar553._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar553 = auVar107 * auVar367 + auVar110 * auVar370 + auVar111 * auVar371 + auVar108 * auVar368 +
             auVar109 * auVar369 + auVar553;
  uVar584 = auVar553._0_8_;
  uVar602 = (auVar553._8_8_ * 0x2000 | uVar584 >> 0x33) * 0x13 + (uVar621 & 0x7ffffffffffff);
  uVar618 = (uVar602 >> 0x33) + (uVar610 & 0x7ffffffffffff);
  uVar602 = uVar602 & 0x7ffffffffffff;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar602;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar593;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar618;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar593;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar602;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar590;
  uVar611 = uVar611 & 0x7ffffffffffff;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar611;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar593;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar602;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar591;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar618;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar590;
  uVar604 = uVar604 & 0x7ffffffffffff;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar604;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar593;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar602;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar594;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar611;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar590;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar618;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar591;
  uVar584 = uVar584 & 0x7ffffffffffff;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar584;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar593;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar602;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar592;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar618;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar594;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar604;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar590;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar611;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar591;
  uVar610 = uVar591 * 0x13;
  uVar621 = uVar592 * 0x13;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar618;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar621;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar584;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar590 * 0x13;
  uVar618 = uVar594 * 0x13;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar604;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar610;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar611;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar618;
  auVar625 = auVar140 * auVar400 + auVar139 * auVar399 + auVar138 * auVar398 + auVar122 * auVar382 +
             auVar137 * auVar397;
  uVar622 = auVar625._0_8_;
  uVar602 = auVar625._8_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar611;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar621;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar584;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar610;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar604;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar618;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar604;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar621;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar584;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar618;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar584;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar621;
  auVar554._8_8_ = uVar602 >> 0x33;
  auVar554._0_8_ = uVar602 * 0x2000 | uVar622 >> 0x33;
  auVar554 = auVar143 * auVar403 + auVar141 * auVar401 + auVar142 * auVar402 + auVar124 * auVar384 +
             auVar123 * auVar383 + auVar554;
  uVar611 = auVar554._0_8_;
  uVar602 = auVar554._8_8_;
  auVar555._8_8_ = uVar602 >> 0x33;
  auVar555._0_8_ = uVar602 * 0x2000 | uVar611 >> 0x33;
  auVar555 = auVar126 * auVar386 + auVar144 * auVar404 + auVar125 * auVar385 + auVar145 * auVar405 +
             auVar127 * auVar387 + auVar555;
  uVar604 = auVar555._0_8_;
  uVar602 = auVar555._8_8_;
  auVar556._8_8_ = uVar602 >> 0x33;
  auVar556._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar556 = auVar131 * auVar391 +
             auVar129 * auVar389 + auVar146 * auVar406 + auVar128 * auVar388 + auVar130 * auVar390 +
             auVar556;
  uVar584 = auVar556._0_8_;
  uVar602 = auVar556._8_8_;
  auVar557._8_8_ = uVar602 >> 0x33;
  auVar557._0_8_ = uVar602 * 0x2000 | uVar584 >> 0x33;
  bVar1 = p[0x1f];
  r->y[0] = uVar589;
  r->y[1] = uVar607;
  r->y[2] = uVar595;
  r->y[3] = uVar617;
  auVar557 = auVar136 * auVar396 + auVar135 * auVar395 + auVar132 * auVar392 + auVar133 * auVar393 +
             auVar134 * auVar394 + auVar557;
  uVar589 = auVar557._0_8_;
  r->y[4] = uVar613;
  uVar602 = (auVar557._8_8_ * 0x2000 | uVar589 >> 0x33) * 0x13 + (uVar622 & 0x7ffffffffffff);
  r->z[0] = 1;
  r->z[1] = 0;
  r->z[2] = 0;
  r->z[3] = 0;
  r->z[4] = 0;
  r->x[0] = uVar602 & 0x7ffffffffffff;
  r->x[1] = (uVar602 >> 0x33) + (uVar611 & 0x7ffffffffffff);
  r->x[2] = uVar604 & 0x7ffffffffffff;
  r->x[3] = uVar584 & 0x7ffffffffffff;
  r->x[4] = uVar589 & 0x7ffffffffffff;
  curve25519_square_times(local_58,r->x,1);
  curve25519_square_times(local_88,local_58,2);
  curve25519_mul_noinline(&local_b8,local_88,r->x);
  curve25519_mul_noinline(local_58,&local_b8,local_58);
  curve25519_square_times(local_88,local_58,1);
  curve25519_mul_noinline(&local_b8,local_88,&local_b8);
  curve25519_pow_two5mtwo0_two250mtwo0(&local_b8);
  curve25519_square_times(&local_b8,&local_b8,2);
  curve25519_mul_noinline(r->x,&local_b8,r->x);
  uVar602 = r->x[0];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar588;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar602;
  uVar584 = r->x[1];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar588;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar584;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar620;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar602;
  uVar589 = r->x[2];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar588;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar589;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar605;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar602;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar620;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar584;
  uVar595 = r->x[3];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar588;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar595;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar616;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar602;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar620;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = uVar589;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar605;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar584;
  uVar604 = r->x[4];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar588;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar604;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar587;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar602;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar616;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar584;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar620;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar595;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar605;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = uVar589;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar612;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uVar584;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar620 * 0x13;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = uVar604;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar605 * 0x13;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uVar595;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar615;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = uVar589;
  auVar625 = auVar165 * auVar425 + auVar164 * auVar424 + auVar162 * auVar422 + auVar147 * auVar407 +
             auVar163 * auVar423;
  uVar602 = auVar625._0_8_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar612;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar589;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar605 * 0x13;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = uVar604;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar615;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uVar595;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar612;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar595;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar615;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uVar604;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar612;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = uVar604;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = auVar625._8_8_ * 0x2000 | uVar602 >> 0x33;
  auVar558 = auVar168 * auVar428 + auVar167 * auVar427 + auVar166 * auVar426 + auVar148 * auVar408 +
             auVar149 * auVar409 + auVar558;
  uVar604 = auVar558._0_8_;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = auVar558._8_8_ * 0x2000 | uVar604 >> 0x33;
  auVar559 = auVar151 * auVar411 + auVar170 * auVar430 + auVar169 * auVar429 + auVar150 * auVar410 +
             auVar152 * auVar412 + auVar559;
  uVar595 = auVar559._0_8_;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = auVar559._8_8_ * 0x2000 | uVar595 >> 0x33;
  auVar560 = auVar155 * auVar415 +
             auVar171 * auVar431 + auVar154 * auVar414 + auVar156 * auVar416 + auVar153 * auVar413 +
             auVar560;
  uVar589 = auVar560._0_8_;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = auVar560._8_8_ * 0x2000 | uVar589 >> 0x33;
  auVar561 = auVar160 * auVar420 +
             auVar161 * auVar421 + auVar159 * auVar419 + auVar158 * auVar418 + auVar157 * auVar417 +
             auVar561;
  uVar615 = auVar561._0_8_;
  uVar584 = (auVar561._8_8_ * 0x2000 | uVar615 >> 0x33) * 0x13 + (uVar602 & 0x7ffffffffffff);
  uVar602 = (uVar584 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar584 = uVar584 & 0x7ffffffffffff;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar584;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar593;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar602;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = uVar593;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar584;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uVar590;
  uVar595 = uVar595 & 0x7ffffffffffff;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar595;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar593;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar584;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uVar591;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar602;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = uVar590;
  uVar589 = uVar589 & 0x7ffffffffffff;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar589;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar593;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar584;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar594;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar595;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar590;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar602;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar591;
  uVar615 = uVar615 & 0x7ffffffffffff;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar615;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar593;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar584;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar592;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar602;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar594;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar589;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar590;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar595;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar591;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar602;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar621;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar615;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = uVar590 * 0x13;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar589;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar610;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar595;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar618;
  auVar625 = auVar190 * auVar450 + auVar189 * auVar449 + auVar188 * auVar448 + auVar172 * auVar432 +
             auVar187 * auVar447;
  uVar584 = auVar625._0_8_;
  uVar602 = auVar625._8_8_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar595;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar621;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar615;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar610;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar589;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar618;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar589;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar621;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar615;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar618;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar615;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar621;
  auVar562._8_8_ = uVar602 >> 0x33;
  auVar562._0_8_ = uVar602 * 0x2000 | uVar584 >> 0x33;
  auVar562 = auVar173 * auVar433 +
             auVar174 * auVar434 + auVar192 * auVar452 + auVar193 * auVar453 + auVar191 * auVar451 +
             auVar562;
  uVar589 = auVar562._0_8_;
  uVar602 = auVar562._8_8_;
  auVar577._8_8_ = uVar602 >> 0x33;
  auVar577._0_8_ = uVar602 * 0x2000 | uVar589 >> 0x33;
  auVar577 = auVar177 * auVar437 +
             auVar176 * auVar436 + auVar195 * auVar455 + auVar175 * auVar435 + auVar194 * auVar454 +
             auVar577;
  uVar595 = auVar577._0_8_;
  uVar602 = auVar577._8_8_;
  auVar563._8_8_ = uVar602 >> 0x33;
  auVar563._0_8_ = uVar602 * 0x2000 | uVar595 >> 0x33;
  auVar563 = auVar181 * auVar441 +
             auVar196 * auVar456 + auVar178 * auVar438 + auVar180 * auVar440 + auVar179 * auVar439 +
             auVar563;
  uVar610 = auVar563._0_8_;
  uVar602 = auVar563._8_8_;
  auVar578._8_8_ = uVar602 >> 0x33;
  auVar578._0_8_ = uVar602 * 0x2000 | uVar610 >> 0x33;
  auVar578 = auVar184 * auVar444 +
             auVar183 * auVar443 + auVar182 * auVar442 + auVar185 * auVar445 + auVar186 * auVar446 +
             auVar578;
  uVar621 = auVar578._0_8_;
  uVar584 = (auVar578._8_8_ * 0x2000 | uVar621 >> 0x33) * 0x13 + (uVar584 & 0x7ffffffffffff);
  uVar612 = (uVar584 >> 0x33) + (uVar589 & 0x7ffffffffffff);
  uVar584 = uVar584 & 0x7ffffffffffff;
  uVar595 = uVar595 & 0x7ffffffffffff;
  uVar610 = uVar610 & 0x7ffffffffffff;
  uVar621 = uVar621 & 0x7ffffffffffff;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar584;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uVar584;
  uVar589 = uVar621 * 0x26;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar612;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar589;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar610;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar595 * 0x26;
  lVar596 = 0;
  auVar625 = auVar198 * auVar458 + auVar199 * auVar459 + auVar197 * auVar457;
  uVar604 = auVar625._0_8_;
  uVar602 = uVar584 * 2;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar602;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar612;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar595;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar589;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar610;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar610 * 0x13;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar595;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar602;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar612;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar612;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar610;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar589;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar610;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar602;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar595;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar612 * 2;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar621;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar621 * 0x13;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar621;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar602;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar610;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar612 * 2;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar595;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar595;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = auVar625._8_8_ << 0xd | uVar604 >> 0x33;
  auVar564 = auVar201 * auVar461 + auVar202 * auVar462 + auVar200 * auVar460 + auVar564;
  uVar618 = auVar564._0_8_;
  uVar602 = auVar564._8_8_;
  auVar565._8_8_ = uVar602 >> 0x33;
  auVar565._0_8_ = uVar602 * 0x2000 | uVar618 >> 0x33;
  auVar565 = auVar205 * auVar465 + auVar204 * auVar464 + auVar203 * auVar463 + auVar565;
  uVar589 = auVar565._0_8_;
  uVar602 = auVar565._8_8_;
  auVar579._8_8_ = uVar602 >> 0x33;
  auVar579._0_8_ = uVar602 * 0x2000 | uVar589 >> 0x33;
  auVar579 = auVar207 * auVar467 + auVar206 * auVar466 + auVar208 * auVar468 + auVar579;
  uVar587 = auVar579._0_8_;
  uVar602 = auVar579._8_8_;
  auVar566._8_8_ = uVar602 >> 0x33;
  auVar566._0_8_ = uVar602 * 0x2000 | uVar587 >> 0x33;
  auVar566 = auVar210 * auVar470 + auVar211 * auVar471 + auVar209 * auVar469 + auVar566;
  uVar615 = auVar566._0_8_;
  uVar604 = (auVar566._8_8_ * 0x2000 | uVar615 >> 0x33) * 0x13 + (uVar604 & 0x7ffffffffffff);
  uVar602 = (uVar604 >> 0x33) + (uVar618 & 0x7ffffffffffff);
  uVar604 = uVar604 & 0x7ffffffffffff;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar604;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar600;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar602;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar600;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar604;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar608;
  uVar589 = uVar589 & 0x7ffffffffffff;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar589;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar600;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar585;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar604;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar602;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar608;
  uVar587 = uVar587 & 0x7ffffffffffff;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar587;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = uVar600;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar603;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar604;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar589;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar608;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar585;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar602;
  uVar615 = uVar615 & 0x7ffffffffffff;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar615;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar600;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar586;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar604;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar603;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar602;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar587;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar608;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar589;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar585;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar602;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar606;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar615;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar598;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar587;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar614;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar589;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar619;
  auVar625 = auVar227 * auVar487 +
             auVar212 * auVar472 + auVar228 * auVar488 + auVar230 * auVar490 + auVar229 * auVar489;
  uVar604 = auVar625._0_8_;
  uVar602 = auVar625._8_8_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar589;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar606;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar615;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar614;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar587;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar619;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar587;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar606;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar615;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar619;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar615;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar606;
  auVar567._8_8_ = uVar602 >> 0x33;
  auVar567._0_8_ = uVar602 * 0x2000 | uVar604 >> 0x33;
  auVar567 = auVar232 * auVar492 + auVar231 * auVar491 + auVar233 * auVar493 + auVar214 * auVar474 +
             auVar213 * auVar473 + auVar567;
  uVar589 = auVar567._0_8_;
  uVar602 = auVar567._8_8_;
  auVar568._8_8_ = uVar602 >> 0x33;
  auVar568._0_8_ = uVar602 * 0x2000 | uVar589 >> 0x33;
  auVar568 = auVar216 * auVar476 + auVar235 * auVar495 + auVar234 * auVar494 + auVar215 * auVar475 +
             auVar217 * auVar477 + auVar568;
  uVar618 = auVar568._0_8_;
  uVar602 = auVar568._8_8_;
  auVar569._8_8_ = uVar602 >> 0x33;
  auVar569._0_8_ = uVar602 * 0x2000 | uVar618 >> 0x33;
  uVar618 = uVar618 & 0x7ffffffffffff;
  auVar569 = auVar236 * auVar496 + auVar218 * auVar478 + auVar220 * auVar480 + auVar219 * auVar479 +
             auVar221 * auVar481 + auVar569;
  uVar585 = auVar569._0_8_;
  uVar602 = auVar569._8_8_;
  auVar570._8_8_ = uVar602 >> 0x33;
  auVar570._0_8_ = uVar602 * 0x2000 | uVar585 >> 0x33;
  uVar585 = uVar585 & 0x7ffffffffffff;
  auVar570 = auVar223 * auVar483 + auVar222 * auVar482 + auVar226 * auVar486 + auVar225 * auVar485 +
             auVar224 * auVar484 + auVar570;
  uVar615 = auVar570._0_8_;
  uVar602 = (auVar570._8_8_ * 0x2000 | uVar615 >> 0x33) * 0x13 + (uVar604 & 0x7ffffffffffff);
  lVar582 = (uVar602 >> 0x33) + (uVar589 & 0x7ffffffffffff);
  uVar602 = uVar602 & 0x7ffffffffffff;
  uVar589 = (uVar602 - uVar593) + 0x1fffffffffffb4;
  uVar604 = (lVar582 - uVar590) + 0x1ffffffffffffc + (uVar589 >> 0x33);
  uVar598 = (uVar618 - uVar591) + 0x1ffffffffffffc + (uVar604 >> 0x33);
  uVar614 = (uVar585 - uVar594) + 0x1ffffffffffffc + (uVar598 >> 0x33);
  uVar615 = uVar615 & 0x7ffffffffffff;
  uVar619 = (uVar615 - uVar592) + 0x1ffffffffffffc + (uVar614 >> 0x33);
  uVar589 = (uVar619 >> 0x33) * 0x13 + (uVar589 & 0x7ffffffffffff);
  uVar606 = (uVar589 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar604 = (uVar606 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar598 = (uVar604 >> 0x33) + (uVar614 & 0x7ffffffffffff);
  uVar614 = (uVar598 >> 0x33) + (uVar619 & 0x7ffffffffffff);
  uVar589 = (uVar614 >> 0x33) * 0x13 + (uVar589 & 0x7ffffffffffff);
  uVar619 = (uVar589 >> 0x33) + (uVar606 & 0x7ffffffffffff);
  uVar604 = (uVar619 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar600 = (uVar604 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar586 = (uVar600 >> 0x33) + (uVar614 & 0x7ffffffffffff);
  uVar606 = (uVar589 & 0x7ffffffffffff) + (uVar586 >> 0x33) * 0x13 + 0x13;
  uVar614 = (uVar606 >> 0x33) + (uVar619 & 0x7ffffffffffff);
  uVar598 = (uVar614 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar604 = (uVar598 >> 0x33) + (uVar600 & 0x7ffffffffffff);
  uVar589 = (uVar604 >> 0x33) + (uVar586 & 0x7ffffffffffff);
  uVar619 = (uVar589 >> 0x33) * 0x13 + (uVar606 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar614 = (uVar614 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar619 >> 0x33);
  uVar598 = (uVar598 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar614 >> 0x33);
  uVar604 = (uVar604 & 0x7ffffffffffff) + 0x7ffffffffffff + (uVar598 >> 0x33);
  uVar619 = uVar614 << 0x33 | uVar619 & 0x7ffffffffffff;
  r->x[0] = uVar584;
  r->x[1] = uVar612;
  r->x[2] = uVar595;
  r->x[3] = uVar610;
  r->x[4] = uVar621;
  do {
    *(char *)((long)&local_b8 + lVar596) = (char)uVar619;
    lVar596 = lVar596 + 1;
    uVar619 = uVar619 >> 8;
  } while (lVar596 != 8);
  puVar597 = auStack_b0;
  uVar614 = uVar598 << 0x26 | uVar614 >> 0xd & 0x3fffffffff;
  lVar596 = 8;
  do {
    *puVar597 = (char)uVar614;
    puVar597 = puVar597 + 1;
    uVar614 = uVar614 >> 8;
    lVar596 = lVar596 + -1;
  } while (lVar596 != 0);
  uVar598 = uVar604 * 0x2000000 | (ulong)((uint)(uVar598 >> 0x1a) & 0x1ffffff);
  lVar596 = 8;
  do {
    *puVar597 = (char)uVar598;
    puVar597 = puVar597 + 1;
    uVar598 = uVar598 >> 8;
    lVar596 = lVar596 + -1;
  } while (lVar596 != 0);
  uVar589 = (uVar589 + 0x7ffffffffffff + (uVar604 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar604 >> 0x27) & 0xfff);
  lVar596 = 8;
  do {
    *puVar597 = (char)uVar589;
    puVar597 = puVar597 + 1;
    uVar589 = uVar589 >> 8;
    lVar596 = lVar596 + -1;
  } while (lVar596 != 0);
  lVar596 = 0;
  auVar625 = (undefined1  [16])0x0;
  do {
    uVar2 = *(undefined4 *)((long)&local_b8 + lVar596);
    uVar589 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
    auVar525._8_4_ = 0;
    auVar525._0_8_ = uVar589;
    auVar525[0xc] = (char)((uint)uVar2 >> 0x18);
    auVar526[8] = (char)((uint)uVar2 >> 0x10);
    auVar526._0_8_ = uVar589;
    auVar526[9] = 0;
    auVar526._10_3_ = auVar525._10_3_;
    auVar531._5_8_ = 0;
    auVar531._0_5_ = auVar526._8_5_;
    auVar626._0_4_ = (undefined4)uVar589;
    auVar527[4] = (char)((uint)uVar2 >> 8);
    auVar527._0_4_ = auVar626._0_4_;
    auVar527[5] = 0;
    auVar527._6_7_ = SUB137(auVar531 << 0x40,6);
    auVar626._4_9_ = auVar527._4_9_;
    auVar626._13_3_ = 0;
    auVar625 = auVar625 | auVar626;
    lVar596 = lVar596 + 4;
  } while (lVar596 != 0x20);
  auVar623._0_8_ = auVar625._8_8_;
  auVar623._8_4_ = auVar625._8_4_;
  auVar623._12_4_ = auVar625._12_4_;
  if (((SUB164(auVar623 | auVar625,4) | SUB164(auVar623 | auVar625,0)) - 1 >> 8 & 1) == 0) {
    uVar602 = uVar602 + uVar593;
    uVar589 = lVar582 + uVar590 + (uVar602 >> 0x33);
    uVar618 = uVar618 + uVar591 + (uVar589 >> 0x33);
    uVar604 = uVar585 + uVar594 + (uVar618 >> 0x33);
    uVar598 = uVar615 + uVar592 + (uVar604 >> 0x33);
    uVar614 = (uVar598 >> 0x33) * 0x13 + (uVar602 & 0x7ffffffffffff);
    uVar589 = (uVar614 >> 0x33) + (uVar589 & 0x7ffffffffffff);
    uVar602 = (uVar589 >> 0x33) + (uVar618 & 0x7ffffffffffff);
    uVar604 = (uVar602 >> 0x33) + (uVar604 & 0x7ffffffffffff);
    uVar598 = (uVar604 >> 0x33) + (uVar598 & 0x7ffffffffffff);
    uVar614 = (uVar598 >> 0x33) * 0x13 + (uVar614 & 0x7ffffffffffff);
    uVar589 = (uVar614 >> 0x33) + (uVar589 & 0x7ffffffffffff);
    uVar618 = (uVar589 >> 0x33) + (uVar602 & 0x7ffffffffffff);
    uVar602 = (uVar618 >> 0x33) + (uVar604 & 0x7ffffffffffff);
    uVar619 = (uVar602 >> 0x33) + (uVar598 & 0x7ffffffffffff);
    uVar614 = (uVar614 & 0x7ffffffffffff) + (uVar619 >> 0x33) * 0x13 + 0x13;
    uVar589 = (uVar614 >> 0x33) + (uVar589 & 0x7ffffffffffff);
    uVar604 = (uVar589 >> 0x33) + (uVar618 & 0x7ffffffffffff);
    uVar598 = (uVar604 >> 0x33) + (uVar602 & 0x7ffffffffffff);
    uVar602 = (uVar598 >> 0x33) + (uVar619 & 0x7ffffffffffff);
    uVar619 = (uVar614 & 0x7ffffffffffff) + (uVar602 >> 0x33) * 0x13 + 0x7ffffffffffed;
    uVar618 = (uVar619 >> 0x33) + (uVar589 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar614 = (uVar618 >> 0x33) + (uVar604 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar589 = (uVar614 >> 0x33) + (uVar598 & 0x7ffffffffffff) + 0x7ffffffffffff;
    uVar604 = uVar618 << 0x33 | uVar619 & 0x7ffffffffffff;
    lVar582 = 0;
    do {
      *(char *)((long)&local_b8 + lVar582) = (char)uVar604;
      lVar582 = lVar582 + 1;
      uVar604 = uVar604 >> 8;
    } while (lVar582 != 8);
    puVar597 = auStack_b0;
    uVar604 = uVar614 << 0x26 | uVar618 >> 0xd & 0x3fffffffff;
    lVar582 = 8;
    do {
      *puVar597 = (char)uVar604;
      puVar597 = puVar597 + 1;
      uVar604 = uVar604 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    uVar604 = uVar589 * 0x2000000 | (ulong)((uint)(uVar614 >> 0x1a) & 0x1ffffff);
    lVar582 = 8;
    do {
      *puVar597 = (char)uVar604;
      puVar597 = puVar597 + 1;
      uVar604 = uVar604 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    uVar602 = (uVar602 + 0x7ffffffffffff + (uVar589 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
              (ulong)((uint)(uVar589 >> 0x27) & 0xfff);
    lVar582 = 8;
    do {
      *puVar597 = (char)uVar602;
      puVar597 = puVar597 + 1;
      uVar602 = uVar602 >> 8;
      lVar582 = lVar582 + -1;
    } while (lVar582 != 0);
    lVar582 = 0;
    auVar625 = (undefined1  [16])0x0;
    do {
      uVar2 = *(undefined4 *)((long)&local_b8 + lVar582);
      uVar602 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
      auVar528._8_4_ = 0;
      auVar528._0_8_ = uVar602;
      auVar528[0xc] = (char)((uint)uVar2 >> 0x18);
      auVar529[8] = (char)((uint)uVar2 >> 0x10);
      auVar529._0_8_ = uVar602;
      auVar529[9] = 0;
      auVar529._10_3_ = auVar528._10_3_;
      auVar532._5_8_ = 0;
      auVar532._0_5_ = auVar529._8_5_;
      auVar627._0_4_ = (undefined4)uVar602;
      auVar530[4] = (char)((uint)uVar2 >> 8);
      auVar530._0_4_ = auVar627._0_4_;
      auVar530[5] = 0;
      auVar530._6_7_ = SUB137(auVar532 << 0x40,6);
      auVar627._4_9_ = auVar530._4_9_;
      auVar627._13_3_ = 0;
      auVar625 = auVar625 | auVar627;
      lVar582 = lVar582 + 4;
    } while (lVar582 != 0x20);
    auVar624._0_8_ = auVar625._8_8_;
    auVar624._8_4_ = auVar625._8_4_;
    auVar624._12_4_ = auVar625._12_4_;
    if (((SUB164(auVar624 | auVar625,4) | SUB164(auVar624 | auVar625,0)) - 1 >> 8 & 1) == 0) {
      return 0;
    }
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar584;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar612;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar584;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar595;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar584;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar612;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar610;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar584;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar595;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar612;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar621;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar584;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar612;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar610;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar595;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar612;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar621;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar610;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar595;
    auVar625 = auVar252 * ZEXT816(0x33abbb585eb627) +
               auVar253 * ZEXT816(0xfdb51be9ed3a7) +
               auVar255 * ZEXT816(0x8eea1b5b85afba) + auVar254 * ZEXT816(0x96c405a207eb20) +
               auVar237 * ZEXT816(0x61b274a0ea0b0);
    uVar604 = auVar625._0_8_;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar595;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar621;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar610;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar610;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar621;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = uVar621;
    auVar571._8_8_ = 0;
    auVar571._0_8_ = auVar625._8_8_ * 0x2000 | uVar604 >> 0x33;
    auVar571 = auVar238 * ZEXT816(0x61b274a0ea0b0) +
               auVar256 * ZEXT816(0x33abbb585eb627) + auVar258 * ZEXT816(0x8eea1b5b85afba) +
               auVar257 * ZEXT816(0x96c405a207eb20) + auVar239 * ZEXT816(0xd5a5fc8f189d) + auVar571;
    uVar595 = auVar571._0_8_;
    auVar572._8_8_ = 0;
    auVar572._0_8_ = auVar571._8_8_ * 0x2000 | uVar595 >> 0x33;
    auVar572 = auVar242 * ZEXT816(0xd5a5fc8f189d) +
               auVar259 * ZEXT816(0x33abbb585eb627) + auVar240 * ZEXT816(0x61b274a0ea0b0) +
               auVar260 * ZEXT816(0x8eea1b5b85afba) + auVar241 * ZEXT816(0x7ef5e9cbd0c60) + auVar572
    ;
    uVar584 = auVar572._0_8_;
    auVar573._8_8_ = 0;
    auVar573._0_8_ = auVar572._8_8_ * 0x2000 | uVar584 >> 0x33;
    uVar584 = uVar584 & 0x7ffffffffffff;
    auVar573 = auVar261 * ZEXT816(0x33abbb585eb627) +
               auVar245 * ZEXT816(0xd5a5fc8f189d) + auVar243 * ZEXT816(0x61b274a0ea0b0) +
               auVar244 * ZEXT816(0x78595a6804c9e) + auVar246 * ZEXT816(0x7ef5e9cbd0c60) + auVar573;
    uVar602 = auVar573._0_8_;
    auVar574._8_8_ = 0;
    auVar574._0_8_ = auVar573._8_8_ * 0x2000 | uVar602 >> 0x33;
    uVar601 = uVar602 & 0x7ffffffffffff;
    auVar574 = auVar248 * ZEXT816(0x2b8324804fc1d) +
               auVar251 * ZEXT816(0x7ef5e9cbd0c60) + auVar250 * ZEXT816(0xd5a5fc8f189d) +
               auVar247 * ZEXT816(0x61b274a0ea0b0) + auVar249 * ZEXT816(0x78595a6804c9e) + auVar574;
    uVar589 = auVar574._0_8_;
    uVar602 = (auVar574._8_8_ * 0x2000 | uVar589 >> 0x33) * 0x13 + (uVar604 & 0x7ffffffffffff);
    uVar583 = (uVar602 >> 0x33) + (uVar595 & 0x7ffffffffffff);
    uVar589 = uVar589 & 0x7ffffffffffff;
    uVar602 = uVar602 & 0x7ffffffffffff;
    r->x[0] = uVar602;
    r->x[1] = uVar583;
    r->x[2] = uVar584;
    r->x[3] = uVar601;
    r->x[4] = uVar589;
  }
  else {
    uVar602 = r->x[0];
    uVar583 = r->x[1];
    uVar584 = r->x[2];
    uVar601 = r->x[3];
    uVar589 = r->x[4];
  }
  uVar595 = (uVar602 >> 0x33) + uVar583;
  uVar604 = (uVar595 >> 0x33) + uVar584;
  uVar598 = (uVar604 >> 0x33) + uVar601;
  uVar614 = (uVar598 >> 0x33) + uVar589;
  uVar610 = (uVar614 >> 0x33) * 0x13 + (uVar602 & 0x7ffffffffffff);
  uVar619 = (uVar610 >> 0x33) + (uVar595 & 0x7ffffffffffff);
  uVar595 = (uVar619 >> 0x33) + (uVar604 & 0x7ffffffffffff);
  uVar606 = (uVar595 >> 0x33) + (uVar598 & 0x7ffffffffffff);
  uVar618 = (uVar606 >> 0x33) + (uVar614 & 0x7ffffffffffff);
  uVar610 = (uVar610 & 0x7ffffffffffff) + (uVar618 >> 0x33) * 0x13 + 0x13;
  uVar604 = (uVar610 >> 0x33) + (uVar619 & 0x7ffffffffffff);
  uVar598 = (uVar604 >> 0x33) + (uVar595 & 0x7ffffffffffff);
  uVar614 = (uVar598 >> 0x33) + (uVar606 & 0x7ffffffffffff);
  uVar595 = (uVar614 >> 0x33) + (uVar618 & 0x7ffffffffffff);
  uVar619 = (uVar610 & 0x7ffffffffffff) + (uVar595 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar618 = (uVar619 >> 0x33) + (uVar604 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar610 = (uVar618 >> 0x33) + (uVar598 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar604 = (uVar610 >> 0x33) + (uVar614 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar598 = uVar618 << 0x33 | uVar619 & 0x7ffffffffffff;
  lVar582 = 0;
  do {
    *(char *)((long)&local_b8 + lVar582) = (char)uVar598;
    lVar582 = lVar582 + 1;
    uVar598 = uVar598 >> 8;
  } while (lVar582 != 8);
  puVar597 = auStack_b0;
  uVar598 = uVar610 << 0x26 | uVar618 >> 0xd & 0x3fffffffff;
  lVar582 = 8;
  do {
    *puVar597 = (char)uVar598;
    puVar597 = puVar597 + 1;
    uVar598 = uVar598 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  uVar598 = uVar604 * 0x2000000 | (ulong)((uint)(uVar610 >> 0x1a) & 0x1ffffff);
  lVar582 = 8;
  do {
    *puVar597 = (char)uVar598;
    puVar597 = puVar597 + 1;
    uVar598 = uVar598 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  uVar595 = (uVar595 + 0x7ffffffffffff + (uVar604 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
            (ulong)((uint)(uVar604 >> 0x27) & 0xfff);
  lVar582 = 8;
  do {
    *puVar597 = (char)uVar595;
    puVar597 = puVar597 + 1;
    uVar595 = uVar595 >> 8;
    lVar582 = lVar582 + -1;
  } while (lVar582 != 0);
  if (((byte)local_b8 & 1) == bVar1 >> 7) {
    uVar595 = ((0xfffffffffffda - uVar602 >> 0x33) - uVar583) + 0xffffffffffffe;
    uVar609 = uVar595 & 0x7ffffffffffff;
    r->x[1] = uVar609;
    uVar584 = ((uVar595 >> 0x33) - uVar584) + 0xffffffffffffe;
    uVar599 = uVar584 & 0x7ffffffffffff;
    r->x[2] = uVar599;
    uVar584 = ((uVar584 >> 0x33) - uVar601) + 0xffffffffffffe;
    uVar601 = uVar584 & 0x7ffffffffffff;
    r->x[3] = uVar601;
    uVar584 = ((uVar584 >> 0x33) - uVar589) + 0xffffffffffffe;
    local_208 = uVar584 & 0x7ffffffffffff;
    r->x[4] = local_208;
    uVar583 = (uVar584 >> 0x33) * 0x13 + (0xfffffffffffda - uVar602 & 0x7ffffffffffff);
    r->x[0] = uVar583;
  }
  else {
    uVar583 = r->x[0];
    uVar609 = r->x[1];
    uVar599 = r->x[2];
    uVar601 = r->x[3];
    local_208 = r->x[4];
  }
  uVar602 = r->y[0];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar583;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar602;
  uVar584 = r->y[1];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar609;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar602;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar583;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar584;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar599;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar602;
  uVar589 = r->y[2];
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar583;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar589;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar609;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar584;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar601;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar602;
  uVar595 = r->y[3];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar583;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar595;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar599;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar584;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar609;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar589;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = local_208;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar602;
  uVar602 = r->y[4] * 0x13;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar583;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = r->y[4];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar609;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar595;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar601;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar584;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar599;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar589;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar609;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar602;
  uVar595 = uVar595 * 0x13;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = local_208;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar584 * 0x13;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar601;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar589 * 0x13;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar599;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar595;
  auVar625 = auVar280 * auVar515 + auVar277 * auVar512 + auVar262 * auVar497 + auVar279 * auVar514 +
             auVar278 * auVar513;
  uVar598 = auVar625._0_8_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar599;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar602;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = local_208;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar589 * 0x13;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar601;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar595;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar601;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar602;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_208;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar595;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = local_208;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar602;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = auVar625._8_8_ * 0x2000 | uVar598 >> 0x33;
  auVar580 = auVar282 * auVar517 +
             auVar283 * auVar518 + auVar281 * auVar516 + auVar263 * auVar498 + auVar264 * auVar499 +
             auVar580;
  uVar584 = auVar580._0_8_;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = auVar580._8_8_ * 0x2000 | uVar584 >> 0x33;
  auVar581 = auVar285 * auVar520 +
             auVar284 * auVar519 + auVar265 * auVar500 + auVar266 * auVar501 + auVar267 * auVar502 +
             auVar581;
  uVar595 = auVar581._0_8_;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = auVar581._8_8_ * 0x2000 | uVar595 >> 0x33;
  auVar524 = auVar286 * auVar521 +
             auVar268 * auVar503 + auVar269 * auVar504 + auVar271 * auVar506 + auVar270 * auVar505 +
             auVar524;
  uVar604 = auVar524._0_8_;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = auVar524._8_8_ << 0xd | uVar604 >> 0x33;
  auVar575 = auVar275 * auVar510 + auVar276 * auVar511 + auVar274 * auVar509 + auVar273 * auVar508 +
             auVar272 * auVar507 + auVar575;
  uVar589 = auVar575._0_8_;
  uVar602 = (auVar575._8_8_ * 0x2000 | uVar589 >> 0x33) * 0x13 + (uVar598 & 0x7ffffffffffff);
  r->t[0] = uVar602 & 0x7ffffffffffff;
  r->t[1] = (uVar602 >> 0x33) + (uVar584 & 0x7ffffffffffff);
  r->t[2] = uVar595 & 0x7ffffffffffff;
  r->t[3] = uVar604 & 0x7ffffffffffff;
  r->t[4] = uVar589 & 0x7ffffffffffff;
  return 1;
}

Assistant:

static int
ge25519_unpack_negative_vartime(ge25519 *r, const unsigned char p[32]) {
	static const unsigned char zero[32] = {0};
	static const bignum25519 one = {1};
	unsigned char parity = p[31] >> 7;
	unsigned char check[32];
	bignum25519 t, root, num, den, d3;

	curve25519_expand(r->y, p);
	curve25519_copy(r->z, one);
	curve25519_square(num, r->y); /* x = y^2 */
	curve25519_mul(den, num, ge25519_ecd); /* den = dy^2 */
	curve25519_sub_reduce(num, num, r->z); /* x = y^1 - 1 */
	curve25519_add(den, den, r->z); /* den = dy^2 + 1 */

	/* Computation of sqrt(num/den) */
	/* 1.: computation of num^((p-5)/8)*den^((7p-35)/8) = (num*den^7)^((p-5)/8) */
	curve25519_square(t, den);
	curve25519_mul(d3, t, den);
	curve25519_square(r->x, d3);
	curve25519_mul(r->x, r->x, den);
	curve25519_mul(r->x, r->x, num);
	curve25519_pow_two252m3(r->x, r->x);

	/* 2. computation of r->x = num * den^3 * (num*den^7)^((p-5)/8) */
	curve25519_mul(r->x, r->x, d3);
	curve25519_mul(r->x, r->x, num);

	/* 3. Check if either of the roots works: */
	curve25519_square(t, r->x);
	curve25519_mul(t, t, den);
	curve25519_sub_reduce(root, t, num);
	curve25519_contract(check, root);
	if (!ed25519_verify(check, zero, 32)) {
		curve25519_add_reduce(t, t, num);
		curve25519_contract(check, t);
		if (!ed25519_verify(check, zero, 32))
			return 0;
		curve25519_mul(r->x, r->x, ge25519_sqrtneg1);
	}

	curve25519_contract(check, r->x);
	if ((check[0] & 1) == parity) {
		curve25519_copy(t, r->x);
		curve25519_neg(r->x, t);
	}
	curve25519_mul(r->t, r->x, r->y);
	return 1;
}